

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QBrush __thiscall QCss::Declaration::brushValue(Declaration *this,QPalette *pal)

{
  bool bVar1;
  int iVar2;
  DeclarationData *pDVar3;
  qsizetype qVar4;
  QPalette *in_RDX;
  QVariant *in_RSI;
  _Head_base<0UL,_QBrushData_*,_false> in_RDI;
  long in_FS_OFFSET;
  BrushData data;
  QPalette *in_stack_00000120;
  Value *in_stack_00000128;
  undefined4 in_stack_ffffffffffffff58;
  ColorRole in_stack_ffffffffffffff5c;
  QVariant *in_stack_ffffffffffffff60;
  _Head_base<0UL,_QBrushData_*,_false> this_00;
  QVariant local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl = in_RDI._M_head_impl;
  pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                     ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f577);
  qVar4 = QList<QCss::Value>::size(&pDVar3->values);
  if (qVar4 != 1) {
    QBrush::QBrush((QBrush *)in_stack_ffffffffffffff60);
    goto LAB_00a2f76e;
  }
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f5a2);
  bVar1 = ::QVariant::isValid(in_stack_ffffffffffffff60);
  if (bVar1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f5c1);
    iVar2 = ::QVariant::userType((QVariant *)0xa2f5cd);
    if (iVar2 == 0x1002) {
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f5de);
      qvariant_cast<QBrush>(in_RSI);
      goto LAB_00a2f76e;
    }
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f5fe);
    iVar2 = ::QVariant::userType((QVariant *)0xa2f60a);
    if (iVar2 == 2) {
      pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa2f623);
      ::QVariant::toInt((bool *)&pDVar3->parsed);
      QPalette::color(in_RDX,in_stack_ffffffffffffff5c);
      QBrush::QBrush((QBrush *)this_00._M_head_impl,(QColor *)in_RDI._M_head_impl,
                     (BrushStyle)((ulong)in_RDX >> 0x20));
      goto LAB_00a2f76e;
    }
  }
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f67a);
  QList<QCss::Value>::at
            ((QList<QCss::Value> *)in_stack_ffffffffffffff60,
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  parseBrushValue(in_stack_00000128,in_stack_00000120);
  ::QVariant::fromValue<QBrush>((QBrush *)in_RDI._M_head_impl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2f732);
  ::QVariant::operator=((QVariant *)in_RDI._M_head_impl,in_stack_ffffffffffffff60);
  ::QVariant::~QVariant(local_48);
  QBrush::QBrush((QBrush *)in_stack_ffffffffffffff60,
                 (QBrush *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  BrushData::~BrushData((BrushData *)0xa2f76e);
LAB_00a2f76e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (DataPtr)(DataPtr)this_00._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

QBrush Declaration::brushValue(const QPalette &pal) const
{
    if (d->values.size() != 1)
        return QBrush();

    if (d->parsed.isValid()) {
        if (d->parsed.userType() == QMetaType::QBrush)
            return qvariant_cast<QBrush>(d->parsed);
        if (d->parsed.userType() == QMetaType::Int)
            return pal.color((QPalette::ColorRole)(d->parsed.toInt()));
    }

    BrushData data = parseBrushValue(d->values.at(0), pal);

    if (data.type == BrushData::Role) {
        d->parsed = QVariant::fromValue<int>(data.role);
        return pal.color((QPalette::ColorRole)(data.role));
    } else {
        if (data.type != BrushData::DependsOnThePalette)
            d->parsed = QVariant::fromValue<QBrush>(data.brush);
        return data.brush;
    }
}